

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

pair<perfetto::base::UnixSocketRaw,_perfetto::base::UnixSocketRaw> *
perfetto::base::UnixSocketRaw::CreatePairPosix
          (pair<perfetto::base::UnixSocketRaw,_perfetto::base::UnixSocketRaw>
           *__return_storage_ptr__,SockFamily family,SockType type)

{
  int iVar1;
  undefined8 extraout_RAX;
  int fds [2];
  UnixSocketRaw local_48;
  ScopedSocketHandle local_38;
  ScopedSocketHandle local_34;
  int local_30;
  int local_2c;
  UnixSocketRaw local_28;
  
  if (family - kUnix < 3) {
    if (type - kStream < 3) {
      iVar1 = socketpair(*(int *)(&DAT_003567a4 + (ulong)(family - kUnix) * 4),
                         *(int *)(&DAT_003567b0 + (ulong)(type - kStream) * 4),0,&local_30);
      if (iVar1 == 0) {
        local_34.t_ = local_30;
        UnixSocketRaw(&local_48,&local_34,family,type);
        local_38.t_ = local_2c;
        UnixSocketRaw(&local_28,&local_38,family,type);
        (__return_storage_ptr__->first).fd_.t_ = local_48.fd_.t_;
        local_48.fd_.t_ = -1;
        (__return_storage_ptr__->first).tx_timeout_ms_ = local_48.tx_timeout_ms_;
        (__return_storage_ptr__->first).family_ = local_48.family_;
        (__return_storage_ptr__->first).type_ = local_48.type_;
        (__return_storage_ptr__->second).fd_.t_ = local_28.fd_.t_;
        local_28.fd_.t_ = -1;
        (__return_storage_ptr__->second).tx_timeout_ms_ = local_28.tx_timeout_ms_;
        (__return_storage_ptr__->second).family_ = local_28.family_;
        (__return_storage_ptr__->second).type_ = local_28.type_;
        ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
        ::reset(&local_28.fd_,-1);
        ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
        ::reset(&local_38,-1);
        ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
        ::reset(&local_48.fd_,-1);
        ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
        ::reset(&local_34,-1);
      }
      else {
        UnixSocketRaw(&local_48);
        UnixSocketRaw(&local_28);
        (__return_storage_ptr__->first).fd_.t_ = local_48.fd_.t_;
        local_48.fd_.t_ = -1;
        (__return_storage_ptr__->first).tx_timeout_ms_ = local_48.tx_timeout_ms_;
        (__return_storage_ptr__->first).family_ = local_48.family_;
        (__return_storage_ptr__->first).type_ = local_48.type_;
        (__return_storage_ptr__->second).fd_.t_ = local_28.fd_.t_;
        local_28.fd_.t_ = -1;
        (__return_storage_ptr__->second).tx_timeout_ms_ = local_28.tx_timeout_ms_;
        (__return_storage_ptr__->second).family_ = local_28.family_;
        (__return_storage_ptr__->second).type_ = local_28.type_;
        ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
        ::reset(&local_28.fd_,-1);
        ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
        ::reset(&local_48.fd_,-1);
      }
      return __return_storage_ptr__;
    }
  }
  else {
    CreatePairPosix();
  }
  CreatePairPosix();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

std::pair<UnixSocketRaw, UnixSocketRaw> UnixSocketRaw::CreatePairPosix(
    SockFamily family,
    SockType type) {
  int fds[2];
  if (socketpair(GetSockFamily(family), GetSockType(type), 0, fds) != 0) {
    return std::make_pair(UnixSocketRaw(), UnixSocketRaw());
  }
  return std::make_pair(UnixSocketRaw(ScopedFile(fds[0]), family, type),
                        UnixSocketRaw(ScopedFile(fds[1]), family, type));
}